

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2shape_index.cc
# Opt level: O0

void __thiscall EncodedS2ShapeIndex::Minimize(EncodedS2ShapeIndex *this)

{
  bool bVar1;
  int iVar2;
  atomic<S2Shape_*> *this_00;
  __pointer_type pSVar3;
  S2Shape *pSVar4;
  size_type sVar5;
  reference piVar6;
  reference pvVar7;
  type paVar8;
  __pointer_type pSVar9;
  __int_type _Stack_c0;
  int offset;
  uint64 bits;
  int local_b0;
  int base;
  int i;
  int pos;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  S2Shape *shape;
  AtomicShape *atomic_shape;
  iterator __end1;
  iterator __begin1;
  vector<EncodedS2ShapeIndex::AtomicShape,_std::allocator<EncodedS2ShapeIndex::AtomicShape>_>
  *__range1;
  EncodedS2ShapeIndex *this_local;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_1;
  
  bVar1 = std::operator==(&this->cells_,(nullptr_t)0x0);
  if (!bVar1) {
    __end1 = std::
             vector<EncodedS2ShapeIndex::AtomicShape,_std::allocator<EncodedS2ShapeIndex::AtomicShape>_>
             ::begin(&this->shapes_);
    atomic_shape = (AtomicShape *)
                   std::
                   vector<EncodedS2ShapeIndex::AtomicShape,_std::allocator<EncodedS2ShapeIndex::AtomicShape>_>
                   ::end(&this->shapes_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<EncodedS2ShapeIndex::AtomicShape_*,_std::vector<EncodedS2ShapeIndex::AtomicShape,_std::allocator<EncodedS2ShapeIndex::AtomicShape>_>_>
                                       *)&atomic_shape), bVar1) {
      this_00 = &__gnu_cxx::
                 __normal_iterator<EncodedS2ShapeIndex::AtomicShape_*,_std::vector<EncodedS2ShapeIndex::AtomicShape,_std::allocator<EncodedS2ShapeIndex::AtomicShape>_>_>
                 ::operator*(&__end1)->super_atomic<S2Shape_*>;
      pSVar3 = std::atomic<S2Shape_*>::load(this_00,memory_order_relaxed);
      pSVar4 = kUndecodedShape();
      if ((pSVar3 != pSVar4) && (pSVar3 != (__pointer_type)0x0)) {
        pSVar4 = kUndecodedShape();
        std::atomic<S2Shape_*>::store(this_00,pSVar4,memory_order_relaxed);
        if (pSVar3 != (__pointer_type)0x0) {
          (*pSVar3->_vptr_S2Shape[1])();
        }
      }
      __gnu_cxx::
      __normal_iterator<EncodedS2ShapeIndex::AtomicShape_*,_std::vector<EncodedS2ShapeIndex::AtomicShape,_std::allocator<EncodedS2ShapeIndex::AtomicShape>_>_>
      ::operator++(&__end1);
    }
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->cell_cache_);
    iVar2 = max_cell_cache_size(this);
    if (sVar5 < (ulong)(long)iVar2) {
      __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->cell_cache_);
      _i = std::vector<int,_std::allocator<int>_>::end(&this->cell_cache_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&i), bVar1) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end2);
        iVar2 = *piVar6;
        pvVar7 = std::
                 vector<std::atomic<unsigned_long_long>,_std::allocator<std::atomic<unsigned_long_long>_>_>
                 ::operator[](&this->cells_decoded_,(long)(iVar2 >> 6));
        std::operator&(memory_order_relaxed,__memory_order_mask);
        (pvVar7->super___atomic_base<unsigned_long_long>)._M_i = 0;
        paVar8 = std::
                 unique_ptr<std::atomic<S2ShapeIndexCell_*>[],_std::default_delete<std::atomic<S2ShapeIndexCell_*>[]>_>
                 ::operator[](&this->cells_,(long)iVar2);
        pSVar9 = std::atomic<S2ShapeIndexCell_*>::load(paVar8,memory_order_relaxed);
        if (pSVar9 != (__pointer_type)0x0) {
          S2ShapeIndexCell::~S2ShapeIndexCell(pSVar9);
          operator_delete(pSVar9);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2);
      }
    }
    else {
      sVar5 = std::
              vector<std::atomic<unsigned_long_long>,_std::allocator<std::atomic<unsigned_long_long>_>_>
              ::size(&this->cells_decoded_);
      local_b0 = (int)sVar5;
      while (local_b0 = local_b0 + -1, -1 < local_b0) {
        pvVar7 = std::
                 vector<std::atomic<unsigned_long_long>,_std::allocator<std::atomic<unsigned_long_long>_>_>
                 ::operator[](&this->cells_decoded_,(long)local_b0);
        std::operator&(memory_order_relaxed,__memory_order_mask);
        _Stack_c0 = (pvVar7->super___atomic_base<unsigned_long_long>)._M_i;
        if (_Stack_c0 != 0) {
          do {
            iVar2 = Bits::FindLSBSetNonZero64(_Stack_c0);
            paVar8 = std::
                     unique_ptr<std::atomic<S2ShapeIndexCell_*>[],_std::default_delete<std::atomic<S2ShapeIndexCell_*>[]>_>
                     ::operator[](&this->cells_,(long)(local_b0 * 0x40 + iVar2));
            pSVar9 = std::atomic<S2ShapeIndexCell_*>::load(paVar8,memory_order_relaxed);
            if (pSVar9 != (__pointer_type)0x0) {
              S2ShapeIndexCell::~S2ShapeIndexCell(pSVar9);
              operator_delete(pSVar9);
            }
            _Stack_c0 = _Stack_c0 - 1 & _Stack_c0;
          } while (_Stack_c0 != 0);
          pvVar7 = std::
                   vector<std::atomic<unsigned_long_long>,_std::allocator<std::atomic<unsigned_long_long>_>_>
                   ::operator[](&this->cells_decoded_,(long)local_b0);
          std::operator&(memory_order_relaxed,__memory_order_mask);
          (pvVar7->super___atomic_base<unsigned_long_long>)._M_i = 0;
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::clear(&this->cell_cache_);
  }
  return;
}

Assistant:

void EncodedS2ShapeIndex::Minimize() {
  if (cells_ == nullptr) return;  // Not initialized yet.

  for (auto& atomic_shape : shapes_) {
    S2Shape* shape = atomic_shape.load(std::memory_order_relaxed);
    if (shape != kUndecodedShape() && shape != nullptr) {
      atomic_shape.store(kUndecodedShape(), std::memory_order_relaxed);
      delete shape;
    }
  }
  if (cell_cache_.size() < max_cell_cache_size()) {
    // When only a tiny fraction of the cells are decoded, we keep track of
    // those cells in cell_cache_ to avoid the cost of scanning the
    // cells_decoded_ vector.  (The cost is only about 1 cycle per 64 cells,
    // but for a huge polygon with 1 million cells that's still 16000 cycles.)
    for (int pos : cell_cache_) {
      cells_decoded_[pos >> 6].store(0, std::memory_order_relaxed);
      delete cells_[pos].load(std::memory_order_relaxed);
    }
  } else {
    // Scan the cells_decoded_ vector looking for cells that must be deleted.
    for (int i = cells_decoded_.size(), base = 0; --i >= 0; base += 64) {
      uint64 bits = cells_decoded_[i].load(std::memory_order_relaxed);
      if (bits == 0) continue;
      do {
        int offset = Bits::FindLSBSetNonZero64(bits);
        delete cells_[(i << 6) + offset].load(std::memory_order_relaxed);
        bits &= bits - 1;
      } while (bits != 0);
      cells_decoded_[i].store(0, std::memory_order_relaxed);
    }
  }
  cell_cache_.clear();
}